

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O1

void __thiscall async_unit_test::async_unit_test(async_unit_test *this,service *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  url_dispatcher *puVar2;
  string local_38;
  
  cppcms::application::application(&this->super_application,s);
  *(undefined ***)this = &PTR__application_0010d930;
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  paVar1 = &local_38.field_2;
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/single","");
  cppcms::url_dispatcher::assign<async_unit_test>(puVar2,&local_38,0x107d5a,(async_unit_test *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  puVar2 = (url_dispatcher *)cppcms::application::dispatcher();
  local_38._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"/multiple","");
  cppcms::url_dispatcher::assign<async_unit_test>(puVar2,&local_38,0x107e44,(async_unit_test *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

async_unit_test(cppcms::service &s) : cppcms::application(s)
	{
		dispatcher().assign("/single",&async_unit_test::single,this);
		dispatcher().assign("/multiple",&async_unit_test::multiple,this);
	}